

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveRight4update3sparse
          (CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *eps,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *vec,int *idx,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs,int *ridx,int *rn,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *eps2,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *vec2,int *idx2,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs2,int *ridx2,int *rn2,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *eps3,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *vec3,int *idx3,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs3,int *ridx3,int *rn3,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *forest,int *forestNum,int *forestIdx)

{
  bool bVar1;
  uint uVar2;
  long in_RDI;
  long in_R8;
  int *in_R9;
  uint *in_stack_00000008;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_00000010;
  long in_stack_00000028;
  cpp_dec_float<50U,_int,_void> *in_stack_00000030;
  cpp_dec_float<50U,_int,_void> *in_stack_00000038;
  long in_stack_00000058;
  int *in_stack_00000060;
  uint *in_stack_00000068;
  long in_stack_00000070;
  uint *in_stack_00000078;
  uint *in_stack_00000080;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_00000320;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_00000328;
  int *in_stack_00000330;
  int *in_stack_00000338;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_00000340;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_00000348;
  int *it;
  int *rperm;
  int k;
  int j;
  int i;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  int *in_stack_00000900;
  int *in_stack_00000908;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_00000910;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_00000918;
  int *in_stack_00000920;
  int *in_stack_00000928;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_00000930;
  cpp_dec_float<50U,_int,_void> *in_stack_fffffffffffff878;
  cpp_dec_float<50U,_int,_void> *pcVar3;
  cpp_dec_float<50U,_int,_void> *in_stack_fffffffffffff880;
  cpp_dec_float<50U,_int,_void> *this_00;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff8e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff8f0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffa60;
  int in_stack_fffffffffffffa6c;
  int *in_stack_fffffffffffffa70;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffa78;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffa80;
  cpp_dec_float<50U,_int,_void> local_558;
  cpp_dec_float<50U,_int,_void> local_520;
  undefined4 local_4e8 [29];
  undefined4 local_474 [15];
  undefined1 local_438 [56];
  undefined4 local_400;
  undefined1 local_3fc [24];
  int in_stack_fffffffffffffc1c;
  int *in_stack_fffffffffffffc20;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffc28;
  int *in_stack_fffffffffffffc30;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffc38;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffc40;
  undefined4 local_38c;
  undefined1 local_388 [56];
  undefined1 local_350 [56];
  uint *local_318;
  long local_310;
  uint local_304;
  uint local_300;
  int local_2fc;
  undefined1 local_2f8 [56];
  undefined1 local_2c0 [56];
  undefined1 local_288 [56];
  undefined1 local_250 [56];
  int *local_218;
  long local_210;
  undefined1 *local_1e8;
  undefined4 *local_1e0;
  long local_1d8;
  undefined4 *local_1d0;
  long local_1c8;
  undefined4 *local_1c0;
  long local_1b8;
  undefined4 *local_1b0;
  long local_1a8;
  undefined1 *local_198;
  undefined1 *local_188;
  undefined1 *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  undefined1 *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  undefined1 *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffee0;
  
  local_198 = local_250;
  local_218 = in_R9;
  local_210 = in_R8;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffff880,in_stack_fffffffffffff878);
  local_188 = local_288;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffff880,in_stack_fffffffffffff878);
  local_178 = local_2c0;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffff880,in_stack_fffffffffffff878);
  pcVar3 = in_stack_00000030;
  this_00 = in_stack_00000038;
  vSolveLright3(in_stack_00000348,in_stack_00000340,in_stack_00000338,in_stack_00000330,
                in_stack_00000328,in_stack_00000320,in_stack_00000900,in_stack_00000908,
                in_stack_00000910,in_stack_00000918,in_stack_00000920,in_stack_00000928,
                in_stack_00000930);
  local_1e8 = local_2f8;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(this_00);
  local_310 = *(long *)(in_RDI + 0x130);
  if (in_stack_00000070 == 0) {
    local_300 = 0;
    for (local_2fc = 0; local_2fc < (int)*in_stack_00000008; local_2fc = local_2fc + 1) {
      local_304 = local_218[local_2fc];
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(this_00,pcVar3);
      local_148 = &stack0xfffffffffffffc3c;
      local_150 = local_2f8;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(this_00,pcVar3);
      local_138 = local_3fc;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(this_00,pcVar3);
      bVar1 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8);
      if (bVar1) {
        enQueueMax(local_218,(int *)&local_300,*(int *)(local_310 + (long)(int)local_304 * 4));
      }
      else {
        local_400 = 0;
        local_1b8 = local_210 + (long)(int)local_304 * 0x38;
        local_1c0 = &local_400;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (this_00,(long_long_type)pcVar3);
      }
    }
    *in_stack_00000008 = local_300;
  }
  else {
    local_318 = in_stack_00000080;
    local_300 = 0;
    for (local_2fc = 0; local_2fc < (int)*in_stack_00000008; local_2fc = local_2fc + 1) {
      local_304 = local_218[local_2fc];
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(this_00,pcVar3);
      local_168 = local_350;
      local_170 = local_2f8;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(this_00,pcVar3);
      local_158 = local_388;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(this_00,pcVar3);
      bVar1 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8);
      if (bVar1) {
        *local_318 = local_304;
        local_318 = local_318 + 1;
        enQueueMax(local_218,(int *)&local_300,*(int *)(local_310 + (long)(int)local_304 * 4));
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(this_00,pcVar3);
      }
      else {
        local_38c = 0;
        local_1a8 = local_210 + (long)(int)local_304 * 0x38;
        local_1b0 = &local_38c;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (this_00,(long_long_type)pcVar3);
      }
    }
    *in_stack_00000008 = local_300;
    *in_stack_00000078 = local_300;
  }
  local_300 = 0;
  for (local_2fc = 0; local_2fc < (int)(in_stack_00000038->data)._M_elems[0];
      local_2fc = local_2fc + 1) {
    local_304 = (in_stack_00000030->data)._M_elems[local_2fc];
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(this_00,pcVar3);
    local_128 = local_438;
    local_130 = local_2f8;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(this_00,pcVar3);
    in_stack_fffffffffffffee0 = in_stack_00000010;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(this_00,pcVar3);
    bVar1 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8);
    if (bVar1) {
      enQueueMax((int *)in_stack_00000030,(int *)&local_300,
                 *(int *)(local_310 + (long)(int)local_304 * 4));
    }
    else {
      local_474[0] = 0;
      local_1c8 = in_stack_00000028 + (long)(int)local_304 * 0x38;
      local_1d0 = local_474;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (this_00,(long_long_type)pcVar3);
    }
  }
  (in_stack_00000038->data)._M_elems[0] = local_300;
  local_300 = 0;
  for (local_2fc = 0; local_2fc < (int)*in_stack_00000068; local_2fc = local_2fc + 1) {
    local_304 = in_stack_00000060[local_2fc];
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(this_00,pcVar3);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(this_00,pcVar3);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(this_00,pcVar3);
    bVar1 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8);
    if (bVar1) {
      enQueueMax(in_stack_00000060,(int *)&local_300,*(int *)(local_310 + (long)(int)local_304 * 4))
      ;
    }
    else {
      local_4e8[0] = 0;
      local_1d8 = in_stack_00000058 + (long)(int)local_304 * 0x38;
      local_1e0 = local_4e8;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (this_00,(long_long_type)pcVar3);
    }
  }
  *in_stack_00000068 = local_300;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(this_00,pcVar3);
  pcVar3 = &local_520;
  uVar2 = vSolveUright(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,in_stack_fffffffffffffc30
                       ,in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,
                       in_stack_fffffffffffffc1c,in_stack_fffffffffffffee0);
  *in_stack_00000008 = uVar2;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(this_00,pcVar3);
  pcVar3 = &local_558;
  uVar2 = vSolveUright(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,in_stack_fffffffffffffc30
                       ,in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,
                       in_stack_fffffffffffffc1c,in_stack_fffffffffffffee0);
  (in_stack_00000038->data)._M_elems[0] = uVar2;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(this_00,pcVar3);
  pcVar3 = (cpp_dec_float<50U,_int,_void> *)&stack0xfffffffffffffa70;
  uVar2 = vSolveUright(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,in_stack_fffffffffffffc30
                       ,in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,
                       in_stack_fffffffffffffc1c,in_stack_fffffffffffffee0);
  *in_stack_00000068 = uVar2;
  if (*(int *)(in_RDI + 400) == 0) {
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(this_00,pcVar3);
    uVar2 = vSolveUpdateRight(in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
                              in_stack_fffffffffffffa70,in_stack_fffffffffffffa6c,
                              in_stack_fffffffffffffa60);
    *in_stack_00000008 = uVar2;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(this_00,pcVar3);
    uVar2 = vSolveUpdateRight(in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
                              in_stack_fffffffffffffa70,in_stack_fffffffffffffa6c,
                              in_stack_fffffffffffffa60);
    (in_stack_00000038->data)._M_elems[0] = uVar2;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(this_00,pcVar3);
    uVar2 = vSolveUpdateRight(in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
                              in_stack_fffffffffffffa70,in_stack_fffffffffffffa6c,
                              in_stack_fffffffffffffa60);
    *in_stack_00000068 = uVar2;
  }
  return;
}

Assistant:

void CLUFactor<R>::vSolveRight4update3sparse(R eps, R* vec, int* idx,         /* result1 */
      R* rhs, int* ridx, int& rn,        /* rhs1    */
      R eps2, R* vec2, int* idx2,     /* result2 */
      R* rhs2, int* ridx2, int& rn2,     /* rhs2    */
      R eps3, R* vec3, int* idx3,     /* result3 */
      R* rhs3, int* ridx3, int& rn3,     /* rhs3    */
      R* forest, int* forestNum, int* forestIdx)
{
   vSolveLright3(rhs, ridx, rn, eps, rhs2, ridx2, rn2, eps2, rhs3, ridx3, rn3, eps3);
   assert(rn >= 0 && rn <= thedim);
   assert(rn2 >= 0 && rn2 <= thedim);
   assert(rn3 >= 0 && rn3 <= thedim);

   R x;
   int i, j, k;
   int* rperm = row.perm;

   /*  turn index list into a heap */
   if(forest)
   {
      int* it = forestIdx;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
         {
            enQueueMax(ridx, &j, rperm[*it++ = k]);
            forest[k] = x;
         }
         else
            rhs[k] = 0;
      }

      *forestNum = rn = j;
   }
   else
   {
      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
            enQueueMax(ridx, &j, rperm[k]);
         else
            rhs[k] = 0;
      }

      rn = j;
   }

   for(i = j = 0; i < rn2; ++i)
   {
      k = ridx2[i];
      assert(k >= 0 && k < thedim);
      x = rhs2[k];

      if(isNotZero(x, eps2))
         enQueueMax(ridx2, &j, rperm[k]);
      else
         rhs2[k] = 0;
   }

   rn2 = j;

   for(i = j = 0; i < rn3; ++i)
   {
      k = ridx3[i];
      assert(k >= 0 && k < thedim);
      x = rhs3[k];

      if(isNotZero(x, eps3))
         enQueueMax(ridx3, &j, rperm[k]);
      else
         rhs3[k] = 0;
   }

   rn3 = j;

   rn = vSolveUright(vec, idx, rhs, ridx, rn, eps);
   rn2 = vSolveUright(vec2, idx2, rhs2, ridx2, rn2, eps2);
   rn3 = vSolveUright(vec3, idx3, rhs3, ridx3, rn3, eps3);

   if(!l.updateType)             /* no Forest-Tomlin Updates */
   {
      rn = vSolveUpdateRight(vec, idx, rn, eps);
      rn2 = vSolveUpdateRight(vec2, idx2, rn2, eps2);
      rn3 = vSolveUpdateRight(vec3, idx3, rn3, eps3);
   }
}